

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineAlgo.cpp
# Opt level: O1

void anon_unknown.dwarf_9a259::testIntersect
               (Line3f *line,V3f *v0,V3f *v1,V3f *v2,V3f *point,bool front,bool returnValue)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  float fVar11;
  bool fr;
  V3f pt;
  V3f bary;
  bool local_59;
  Vec3<float> local_58;
  Vec3<float> local_4c;
  undefined8 local_40;
  float local_38;
  
  bVar9 = Imath_3_2::intersect<float>(line,v0,v1,v2,&local_58,&local_4c,&local_59);
  if (bVar9 != returnValue) {
    __assert_fail("rv == returnValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                  ,0x9d,
                  "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                 );
  }
  if (!bVar9) {
    return;
  }
  if (local_59 != front) {
    __assert_fail("front == fr",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                  ,0xa3,
                  "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                 );
  }
  fVar11 = point->x;
  if ((float)(~-(uint)(fVar11 < local_58.x) & (uint)(fVar11 - local_58.x) |
             (uint)(local_58.x - fVar11) & -(uint)(fVar11 < local_58.x)) <= 1.1920929e-06) {
    uVar8 = 0;
    do {
      uVar10 = uVar8;
      if (uVar10 == 2) break;
      fVar11 = (&local_58.y)[uVar10];
      fVar1 = (&point->y)[uVar10];
      uVar8 = uVar10 + 1;
    } while ((float)(~-(uint)(fVar1 < fVar11) & (uint)(fVar1 - fVar11) |
                    (uint)(fVar11 - fVar1) & -(uint)(fVar1 < fVar11)) <= 1.1920929e-06);
    if (1 < uVar10) {
      uVar2 = v0->x;
      uVar5 = v0->y;
      uVar3 = v1->x;
      uVar6 = v1->y;
      uVar4 = v2->x;
      uVar7 = v2->y;
      fVar11 = local_4c.z * (float)uVar4 + local_4c.y * (float)uVar3 + local_4c.x * (float)uVar2;
      local_40 = CONCAT44(local_4c.z * (float)uVar7 +
                          local_4c.y * (float)uVar6 + local_4c.x * (float)uVar5,fVar11);
      local_38 = v2->z * local_4c.z + v1->z * local_4c.y + v0->z * local_4c.x;
      if ((float)(~-(uint)(fVar11 < local_58.x) & (uint)(fVar11 - local_58.x) |
                 (uint)(local_58.x - fVar11) & -(uint)(fVar11 < local_58.x)) <= 1.1920929e-06) {
        uVar8 = 0;
        do {
          uVar10 = uVar8;
          if (uVar10 == 2) break;
          fVar11 = (&local_58.y)[uVar10];
          fVar1 = *(float *)((long)&local_40 + uVar10 * 4 + 4);
          uVar8 = uVar10 + 1;
        } while ((float)(~-(uint)(fVar1 < fVar11) & (uint)(fVar1 - fVar11) |
                        (uint)(fVar11 - fVar1) & -(uint)(fVar1 < fVar11)) <= 1.1920929e-06);
        if (1 < uVar10) {
          return;
        }
      }
      __assert_fail("pt.equalWithAbsError (pt2, e)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                    ,0xa6,
                    "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
                   );
    }
  }
  __assert_fail("pt.equalWithAbsError (point, e)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                ,0xa4,
                "void (anonymous namespace)::testIntersect(const Line3f &, const V3f &, const V3f &, const V3f &, const V3f &, bool, bool)"
               );
}

Assistant:

void
testIntersect (
    const Line3f& line,
    const V3f&    v0,
    const V3f&    v1,
    const V3f&    v2,
    const V3f&    point,
    bool          front,
    bool          returnValue)
{
    V3f  pt;
    V3f  bary;
    bool fr;

    bool rv = intersect (line, v0, v1, v2, pt, bary, fr);

    assert (rv == returnValue);

    float e = 10 * std::numeric_limits<float>::epsilon ();

    if (rv)
    {
        assert (front == fr);
        assert (pt.equalWithAbsError (point, e));
        V3f pt2 = v0 * bary.x + v1 * bary.y + v2 * bary.z;
        assert (pt.equalWithAbsError (pt2, e));
    }
}